

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

void __thiscall Js::Utf8SourceInfo::Dispose(Utf8SourceInfo *this,bool isShutdown)

{
  nullptr_t local_28;
  nullptr_t local_20;
  undefined1 local_11;
  Utf8SourceInfo *pUStack_10;
  bool isShutdown_local;
  Utf8SourceInfo *this_local;
  
  local_11 = isShutdown;
  pUStack_10 = this;
  ClearDebugDocument(this,true);
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_unsigned_char>::operator=(&this->debugModeSource,&local_20);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::operator=(&this->sourceRef,&local_28);
  return;
}

Assistant:

void
    Utf8SourceInfo::Dispose(bool isShutdown)
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        ClearDebugDocument();
        this->debugModeSource = nullptr;
#endif
#ifndef NTBUILD
        this->sourceRef = nullptr;
#endif
    }